

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
::operator()(CallDeleter<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
             *this,_func_void_Entry_ptr_size_t *deleter,Entry *data,size_t size)

{
  size_t sVar1;
  pointer pcVar2;
  Entry *pEVar3;
  long lVar4;
  
  if (deleter != (_func_void_Entry_ptr_size_t *)0x0) {
    (*deleter)(data,size);
    return;
  }
  if (data != (Entry *)0x0) {
    pEVar3 = data + -1;
    sVar1 = data[-1].id;
    if (sVar1 != 0) {
      lVar4 = 0;
      do {
        pcVar2 = data[sVar1 - 1].environment._M_dataplus._M_p;
        if (&data[sVar1 - 1].environment.field_2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2) {
          operator_delete(pcVar2);
        }
        pcVar2 = data[sVar1 - 1].defaultValue._M_dataplus._M_p;
        if (&data[sVar1 - 1].defaultValue.field_2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2) {
          operator_delete(pcVar2);
        }
        pcVar2 = data[sVar1 - 1].helpKey._M_dataplus._M_p;
        if (&data[sVar1 - 1].helpKey.field_2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2) {
          operator_delete(pcVar2);
        }
        pcVar2 = data[sVar1 - 1].help._M_dataplus._M_p;
        if (&data[sVar1 - 1].help.field_2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2) {
          operator_delete(pcVar2);
        }
        pcVar2 = data[sVar1 - 1].key._M_dataplus._M_p;
        if (&data[sVar1 - 1].key.field_2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2) {
          operator_delete(pcVar2);
        }
        data = data + -1;
        lVar4 = lVar4 + 0xb0;
      } while (sVar1 * 0xb0 - lVar4 != 0);
    }
    operator_delete__(&pEVar3->id);
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }